

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

TCGArg do_constant_folding(TCGContext_conflict9 *s,TCGOpcode op,TCGArg x,TCGArg y)

{
  TCGOpDef *pTVar1;
  TCGArg local_38;
  TCGArg res;
  TCGOpDef *def;
  TCGArg y_local;
  TCGArg x_local;
  TCGOpcode op_local;
  TCGContext_conflict9 *s_local;
  
  pTVar1 = s->tcg_op_defs;
  local_38 = do_constant_folding_2(op,x,y);
  if ((pTVar1[op].flags & 0x10) == 0) {
    local_38 = (TCGArg)(int)local_38;
  }
  return local_38;
}

Assistant:

static TCGArg do_constant_folding(TCGContext *s, TCGOpcode op, TCGArg x, TCGArg y)
{
    const TCGOpDef *def = &s->tcg_op_defs[op];
    TCGArg res = do_constant_folding_2(op, x, y);
    if (!(def->flags & TCG_OPF_64BIT)) {
        res = (int32_t)res;
    }
    return res;
}